

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O1

void __thiscall Storage::Disk::Drive::end_writing(Drive *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  PCMTrack *__tmp;
  element_type *peVar3;
  PCMTrack *pPVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  
  if (this->is_reading_ != false) {
    return;
  }
  this->is_reading_ = true;
  if ((this->patched_track_).super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    peVar1 = (this->track_).super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 == (element_type *)0x0) {
      peVar3 = (element_type *)0x0;
    }
    else {
      peVar3 = (element_type *)__dynamic_cast(peVar1,&Track::typeinfo,&PCMTrack::typeinfo);
    }
    if (peVar3 == (element_type *)0x0) {
      peVar3 = (element_type *)0x0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var5 = (this->track_).super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
    }
    (this->patched_track_).super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar3;
    this_00 = (this->patched_track_).
              super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->patched_track_).super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pPVar4 = (this->patched_track_).
             super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pPVar4 != (PCMTrack *)0x0) {
      bVar2 = PCMTrack::is_resampled_clone(pPVar4);
      if (bVar2) goto LAB_00442575;
    }
    pPVar4 = PCMTrack::resampled_clone
                       ((this->track_).
                        super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        3200000);
    std::__shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>::
    reset<Storage::Disk::PCMTrack>
              (&(this->patched_track_).
                super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>,pPVar4);
  }
LAB_00442575:
  PCMTrack::add_segment
            ((this->patched_track_).
             super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &this->write_start_time_,&this->write_segment_,this->clamp_writing_to_index_hole_);
  this->cycles_since_index_hole_ =
       this->cycles_since_index_hole_ % (long)this->cycles_per_revolution_;
  invalidate_track(this);
  return;
}

Assistant:

void Drive::end_writing() {
	// If the user modifies a track, it's scaled up to a "high" resolution and modifications
	// are plotted on top of that.
	//
	// "High" is defined as: two samples per clock relative to an idiomatic
	// 8Mhz disk controller and 300RPM disk speed.
	const size_t high_resolution_track_rate = 3200000;

	if(!is_reading_) {
		is_reading_ = true;

		if(!patched_track_) {
			// Avoid creating a new patched track if this one is already patched
			patched_track_ = std::dynamic_pointer_cast<PCMTrack>(track_);
			if(!patched_track_ || !patched_track_->is_resampled_clone()) {
				Track *const tr = track_.get();
				patched_track_.reset(PCMTrack::resampled_clone(tr, high_resolution_track_rate));
			}
		}
		patched_track_->add_segment(write_start_time_, write_segment_, clamp_writing_to_index_hole_);
		cycles_since_index_hole_ %= cycles_per_revolution_;
		invalidate_track();
	}
}